

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_unittest.cc
# Opt level: O2

void __thiscall bssl::VerifyTest_DepthLimit_Test::TestBody(VerifyTest_DepthLimit_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string *psVar2;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  CertificateVerifyStatus *in_R8;
  char *message;
  char *in_R9;
  AssertHelper local_178;
  AssertHelper local_170;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 local_140;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> roots;
  VerifyError error;
  string intermediate2;
  string intermediate1;
  string leaf;
  undefined1 local_a0 [56];
  tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_> local_68;
  _Storage<long,_true> local_58;
  bool local_50;
  uint32_t local_30;
  
  filename._M_str = (char *)error.offset_;
  filename._M_len =
       (size_t)roots._M_t.
               super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
               .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  GetTestdata_abi_cxx11_(filename);
  filename_00._M_str = (char *)error.offset_;
  filename_00._M_len =
       (size_t)roots._M_t.
               super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
               .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  GetTestdata_abi_cxx11_(filename_00);
  filename_01._M_str = (char *)error.offset_;
  filename_01._M_len =
       (size_t)roots._M_t.
               super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
               .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  GetTestdata_abi_cxx11_(filename_01);
  CertificateVerifyOptions::CertificateVerifyOptions((CertificateVerifyOptions *)local_a0);
  local_a0._8_8_ = leaf._M_string_length;
  local_a0._16_8_ = leaf._M_dataplus._M_p;
  paVar1 = &error.diagnostic_.field_2;
  error.offset_ = intermediate1._M_string_length;
  error._8_8_ = intermediate1._M_dataplus._M_p;
  error.diagnostic_._M_dataplus._M_p = (pointer)intermediate2._M_string_length;
  error.diagnostic_._M_string_length = (size_type)intermediate2._M_dataplus._M_p;
  ::std::
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::_M_assign_aux<std::basic_string_view<char,std::char_traits<char>>const*>
            ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)(local_a0 + 0x18),&error,paVar1);
  if (local_50 == false) {
    local_50 = true;
  }
  local_58._M_value = 0x59640654;
  local_30 = 5;
  MozillaRootStore();
  error.offset_ = -1;
  local_68.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
       (_Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
       roots._M_t.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  error.code_ = VERIFICATION_FAILURE;
  error.diagnostic_._M_string_length = 0;
  error.diagnostic_.field_2._M_local_buf[0] = '\0';
  error.diagnostic_._M_dataplus._M_p = (pointer)paVar1;
  CertificateVerify_abi_cxx11_
            ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar,(bssl *)local_a0,(CertificateVerifyOptions *)&error,(VerifyError *)0x0,
             in_R8);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.success_ = (bool)local_140;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ::std::
  _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_178);
    psVar2 = VerifyError::DiagnosticString_abi_cxx11_(&error);
    ::std::operator<<((ostream *)(CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 0x10),
                      (string *)psVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"CertificateVerify(opts, &error)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
               ,0x83,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    ::std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    local_30 = 2;
    CertificateVerify_abi_cxx11_
              ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&gtest_ar,(bssl *)local_a0,(CertificateVerifyOptions *)&error,(VerifyError *)0x0,
               in_R8);
    gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,local_140) ^ 1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    ::std::
    _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_reset((_Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"CertificateVerify(opts, &error)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x87,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      ::std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_._0_4_ = VerifyError::Code(&error);
    local_178.data_._0_4_ = 0xe;
    testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
              ((internal *)&gtest_ar,"error.Code()",
               "VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED",(StatusCode *)&gtest_ar_,
               (StatusCode *)&local_178);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      psVar2 = VerifyError::DiagnosticString_abi_cxx11_(&error);
      ::std::operator<<((ostream *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10),
                        (string *)psVar2);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x88,message);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    this_00 = &gtest_ar.message_;
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  ::std::__cxx11::string::~string((string *)&error.diagnostic_);
  ::std::unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>::
  ~unique_ptr(&roots);
  ::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(local_a0 + 0x18));
  ::std::__cxx11::string::~string((string *)&intermediate2);
  ::std::__cxx11::string::~string((string *)&intermediate1);
  ::std::__cxx11::string::~string((string *)&leaf);
  return;
}

Assistant:

TEST(VerifyTest, DepthLimit) {
  const std::string leaf = GetTestdata("google-leaf.der");
  const std::string intermediate1 = GetTestdata("google-intermediate1.der");
  const std::string intermediate2 = GetTestdata("google-intermediate2.der");
  CertificateVerifyOptions opts;
  opts.leaf_cert = leaf;
  opts.intermediates = {intermediate1, intermediate2};
  opts.time = 1499727444;
  // Set the |max_path_building_depth| explicitly to test the non-default case.
  // Depth of 5 is enough to successfully find a path.
  opts.max_path_building_depth = 5;
  std::unique_ptr<VerifyTrustStore> roots = MozillaRootStore();
  opts.trust_store = roots.get();

  VerifyError error;
  ASSERT_TRUE(CertificateVerify(opts, &error)) << error.DiagnosticString();

  // Depth of 2 is not enough to find a path.
  opts.max_path_building_depth = 2;
  EXPECT_FALSE(CertificateVerify(opts, &error));
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED)
      << error.DiagnosticString();
}